

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O3

bool Assimp::Blender::read<Assimp::Blender::MEdge>
               (Structure *s,MEdge *p,size_t cnt,FileDatabase *db)

{
  int *piVar1;
  MEdge read;
  MEdge local_50;
  
  if (cnt != 0) {
    piVar1 = &p->v1;
    do {
      local_50.super_ElemBase.dna_type = (char *)0x0;
      local_50.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_007e0dc0;
      Structure::Convert<Assimp::Blender::MEdge>(s,&local_50,db);
      *(char **)(piVar1 + -2) = local_50.super_ElemBase.dna_type;
      *(undefined8 *)piVar1 = local_50._16_8_;
      piVar1[2] = local_50._24_4_;
      piVar1 = piVar1 + 8;
      cnt = cnt - 1;
    } while (cnt != 0);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }